

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_smin_i32_mips64(TCGContext_conflict5 *tcg_ctx,TCGv_i32 ret,TCGv_i32 a,TCGv_i32 b)

{
  tcg_gen_movcond_i32_mips64(tcg_ctx,TCG_COND_LT,ret,a,b,a,b);
  return;
}

Assistant:

void tcg_gen_smin_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 a, TCGv_i32 b)
{
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LT, ret, a, b, a, b);
}